

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void R_InitTextureMapping(void)

{
  int iVar1;
  double dVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  angle_t *paVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double __x;
  double dVar10;
  
  dVar2 = FocalTangent;
  FocalLengthX = CenterX / FocalTangent;
  FocalLengthY = FocalLengthX * YaspectMul;
  dVar9 = tan(FieldOfView.Degrees * 0.008726646259971648);
  iVar1 = centerx;
  iVar7 = viewwidth;
  viewingrangerecip = SUB84(1.0 / dVar9 + 103079215104.0,0);
  lVar4 = (long)centerx;
  dVar9 = (double)centerx;
  lVar8 = (long)viewwidth;
  paVar6 = xtoviewangle + lVar4;
  __x = 0.0;
  for (; lVar4 <= lVar8; lVar4 = lVar4 + 1) {
    dVar10 = atan(__x);
    *paVar6 = (angle_t)(long)(dVar10 * -683565275.5764316 + 4294967296.0);
    __x = __x + dVar2 / dVar9;
    paVar6 = paVar6 + 1;
  }
  uVar3 = 0;
  uVar5 = (ulong)(uint)iVar1;
  if (iVar1 < 1) {
    uVar5 = uVar3;
  }
  for (; iVar7 = iVar7 + -1, uVar5 * 4 != uVar3; uVar3 = uVar3 + 4) {
    *(angle_t *)((long)xtoviewangle + uVar3) = -xtoviewangle[iVar7];
  }
  return;
}

Assistant:

void R_InitTextureMapping ()
{
	int i;

	// Calc focallength so FieldOfView angles cover viewwidth.
	FocalLengthX = CenterX / FocalTangent;
	FocalLengthY = FocalLengthX * YaspectMul;

	// This is 1/FocalTangent before the widescreen extension of FOV.
	viewingrangerecip = FLOAT2FIXED(1. / tan(FieldOfView.Radians() / 2));


	// Now generate xtoviewangle for sky texture mapping.
	// [RH] Do not generate viewangletox, because texture mapping is no
	// longer done with trig, so it's not needed.
	const double slopestep = FocalTangent / centerx;
	double slope;

	for (i = centerx, slope = 0; i <= viewwidth; i++, slope += slopestep)
	{
		xtoviewangle[i] = angle_t((2 * M_PI - atan(slope)) * (ANGLE_180 / M_PI));
	}
	for (i = 0; i < centerx; i++)
	{
		xtoviewangle[i] = 0 - xtoviewangle[viewwidth - i - 1];
	}
}